

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O3

int32_t getDataBlock(UNewTrie2 *trie,UChar32 c,UBool forLSCP)

{
  int32_t *piVar1;
  uint uVar2;
  int32_t iVar3;
  long lVar4;
  uint32_t *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint32_t *puVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  
  bVar13 = 0;
  iVar3 = getIndex2Block(trie,c,forLSCP);
  uVar10 = 0xffffffff;
  if (-1 < iVar3) {
    uVar12 = iVar3 + ((uint)c >> 5 & 0x3f);
    uVar10 = trie->index2[uVar12];
    if ((trie->dataNullOffset == uVar10) || (trie->map[(int)uVar10 >> 5] != 1)) {
      uVar11 = trie->firstFreeBlock;
      if (uVar11 == 0) {
        uVar2 = trie->dataCapacity;
        uVar11 = trie->dataLength;
        if ((int)uVar2 < (int)(uVar11 + 0x20)) {
          iVar6 = 0x20000;
          if ((0x1ffff < (int)uVar2) && (iVar6 = 0x110480, 0x11047f < uVar2)) {
            return -1;
          }
          puVar5 = (uint32_t *)uprv_malloc_63((ulong)(uint)(iVar6 * 4));
          if (puVar5 == (uint32_t *)0x0) {
            return -1;
          }
          puVar9 = trie->data;
          memcpy(puVar5,puVar9,(long)trie->dataLength << 2);
          uprv_free_63(puVar9);
          trie->data = puVar5;
          trie->dataCapacity = iVar6;
        }
        trie->dataLength = uVar11 + 0x20;
        lVar4 = (long)((int)uVar11 >> 5);
      }
      else {
        lVar4 = (long)((int)uVar11 >> 5);
        trie->firstFreeBlock = -trie->map[lVar4];
      }
      puVar5 = trie->data + (int)uVar10;
      puVar9 = trie->data + (int)uVar11;
      for (lVar8 = 0x20; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar9 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar13 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
      }
      trie->map[lVar4] = 0;
      uVar10 = 0xffffffff;
      if (-1 < (int)uVar11) {
        trie->map[uVar11 >> 5] = trie->map[uVar11 >> 5] + 1;
        iVar6 = trie->index2[uVar12];
        iVar7 = iVar6 >> 5;
        piVar1 = trie->map + iVar7;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          trie->map[iVar7] = -trie->firstFreeBlock;
          trie->firstFreeBlock = iVar6;
        }
        trie->index2[uVar12] = uVar11;
        uVar10 = uVar11;
      }
    }
  }
  return uVar10;
}

Assistant:

static int32_t
getDataBlock(UNewTrie2 *trie, UChar32 c, UBool forLSCP) {
    int32_t i2, oldBlock, newBlock;

    i2=getIndex2Block(trie, c, forLSCP);
    if(i2<0) {
        return -1;  /* program error */
    }

    i2+=(c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
    oldBlock=trie->index2[i2];
    if(isWritableBlock(trie, oldBlock)) {
        return oldBlock;
    }

    /* allocate a new data block */
    newBlock=allocDataBlock(trie, oldBlock);
    if(newBlock<0) {
        /* out of memory in the data array */
        return -1;
    }
    setIndex2Entry(trie, i2, newBlock);
    return newBlock;
}